

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptor::CopyJsonNameTo(FieldDescriptor *this,FieldDescriptorProto *proto)

{
  DescriptorStringView value;
  uint32_t *puVar1;
  Arena *arena;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *this_local;
  
  value = json_name_abi_cxx11_(this);
  puVar1 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 0x10;
  arena = MessageLite::GetArena((MessageLite *)proto);
  internal::ArenaStringPtr::Set<>(&(proto->field_0)._impl_.json_name_,value,arena);
  return;
}

Assistant:

void FieldDescriptor::CopyJsonNameTo(FieldDescriptorProto* proto) const {
  proto->set_json_name(json_name());
}